

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutoGeometry.cpp
# Opt level: O1

HaF32 HACD::fm_computeMeshVolume(HaF32 *vertices,size_t tcount,HaU32 *indices)

{
  float fVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  
  auVar7 = ZEXT816(0) << 0x40;
  auVar8 = ZEXT1664(auVar7);
  if (tcount != 0) {
    uVar2 = 1;
    do {
      uVar3 = (ulong)(*indices * 3);
      uVar4 = (ulong)(indices[1] * 3);
      uVar5 = (ulong)(indices[2] * 3);
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)((float)vertices[uVar5 + 1] * (float)vertices[uVar4] *
                                             (float)vertices[uVar3 + 2])),
                               ZEXT416((uint)vertices[uVar5 + 2]),
                               ZEXT416((uint)((float)vertices[uVar3] * (float)vertices[uVar4 + 1])))
      ;
      auVar7 = vfmadd213ss_fma(ZEXT416((uint)((float)vertices[uVar5] * (float)vertices[uVar3 + 1])),
                               ZEXT416((uint)vertices[uVar4 + 2]),auVar7);
      auVar7 = vfnmadd213ss_fma(ZEXT416((uint)((float)vertices[uVar5 + 1] * (float)vertices[uVar3]))
                                ,ZEXT416((uint)vertices[uVar4 + 2]),auVar7);
      auVar7 = vfnmadd213ss_fma(ZEXT416((uint)((float)vertices[uVar3 + 1] * (float)vertices[uVar4]))
                                ,ZEXT416((uint)vertices[uVar5 + 2]),auVar7);
      auVar7 = vfnmadd213ss_fma(ZEXT416((uint)((float)vertices[uVar4 + 1] * (float)vertices[uVar5]))
                                ,ZEXT416((uint)vertices[uVar3 + 2]),auVar7);
      fVar1 = auVar8._0_4_ + auVar7._0_4_;
      auVar8 = ZEXT464((uint)fVar1);
      indices = indices + 3;
      uVar3 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar3 < tcount);
    auVar7 = ZEXT416((uint)(fVar1 * 0.16666667));
  }
  auVar6._8_4_ = 0x80000000;
  auVar6._0_8_ = 0x8000000080000000;
  auVar6._12_4_ = 0x80000000;
  auVar6 = vxorps_avx512vl(auVar7,auVar6);
  auVar7 = vmaxss_avx(auVar6,auVar7);
  return auVar7._0_4_;
}

Assistant:

hacd::HaF32  fm_computeMeshVolume(const hacd::HaF32 *vertices,size_t tcount,const hacd::HaU32 *indices)
	{
		hacd::HaF32 volume = 0;

		for (hacd::HaU32 i=0; i<tcount; i++,indices+=3)
		{
			const hacd::HaF32 *p1 = &vertices[ indices[0]*3 ];
			const hacd::HaF32 *p2 = &vertices[ indices[1]*3 ];
			const hacd::HaF32 *p3 = &vertices[ indices[2]*3 ];
			volume+=det(p1,p2,p3); // compute the volume of the tetrahedran relative to the origin.
		}

		volume*=(1.0f/6.0f);
		if ( volume < 0 )
			volume*=-1;
		return volume;
	}